

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.h
# Opt level: O1

SSTableData * __thiscall
DiskTable::
merge<std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*,std::vector<SSTableDataEntry,std::allocator<SSTableDataEntry>>*>
          (SSTableData *__return_storage_ptr__,DiskTable *this,
          vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *datas,
          vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_> *datas_1)

{
  SSTableDataEntry *pSVar1;
  long lVar2;
  SSTableDataEntry *pSVar3;
  pointer ppVar4;
  value_type *__x;
  value_type *pvVar5;
  initializer_list<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>
  __l;
  vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
  merge_seqs;
  allocator_type local_51;
  vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
  local_50;
  pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>
  local_38;
  pointer local_28;
  pointer pSStack_20;
  
  local_38.first._M_current =
       (datas->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_38.second._M_current =
       (datas->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_28 = (datas_1->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
             _M_impl.super__Vector_impl_data._M_start;
  pSStack_20 = (datas_1->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
               _M_impl.super__Vector_impl_data._M_finish;
  __l._M_len = 2;
  __l._M_array = &local_38;
  std::
  vector<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
  ::vector(&local_50,__l,&local_51);
  (__return_storage_ptr__->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    __x = ((local_50.
            super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->first)._M_current;
    pvVar5 = ((local_50.
               super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second)._M_current;
    for (ppVar4 = local_50.
                  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar4 != local_50.
                  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar4 = ppVar4 + 1) {
      pSVar3 = (ppVar4->first)._M_current;
      pSVar1 = (ppVar4->second)._M_current;
      if (((pSVar3 != pSVar1) || (__x == pvVar5)) &&
         (((pSVar3 != pSVar1 && (__x == pvVar5)) ||
          (((pSVar3 != pSVar1 || (__x != pvVar5)) &&
           ((pSVar3->key < __x->key ||
            ((pSVar3->key == __x->key && (__x->timestamp < pSVar3->timestamp)))))))))) {
        __x = (ppVar4->first)._M_current;
        pvVar5 = (ppVar4->second)._M_current;
      }
    }
    if (local_50.
        super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_50.
        super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar2 = __x->key;
      ppVar4 = local_50.
               super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pSVar3 = (ppVar4->first)._M_current;
        if ((pSVar3->key == lVar2) && (pSVar3 != (ppVar4->second)._M_current)) {
          (ppVar4->first)._M_current = pSVar3 + 1;
        }
        ppVar4 = ppVar4 + 1;
      } while (ppVar4 != local_50.
                         super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  } while ((__x != pvVar5) &&
          (std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>::push_back
                     (__return_storage_ptr__,__x), __x != pvVar5));
  if (local_50.
      super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>,___gnu_cxx::__normal_iterator<SSTableDataEntry_*,_std::vector<SSTableDataEntry,_std::allocator<SSTableDataEntry>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

SSTableData DiskTable::merge(Datas... datas) {
    /* A MergeSeq is a pair abstracting a Sequence of SSTableDataEntry objects to be merged together.
     * It's made up of two iterator, from same SSTableData object, first one indicating current position of the sequence,
     * second one indicating the end of the sequence, so when first==second, the sequence has been consumed fully.
     */
    auto merge_seqs = std::vector<MergeSeq>{{datas->begin(), datas->end()}...};
    auto merge_result = SSTableData{};
    static auto compare_merge_seqs_prefer_current = [](const MergeSeq &candidate, const MergeSeq &current) {
        /*
         * Determining whether candidate or current has been fully consumed or not.
         * if candidate has ran out of and current not, take current, or vice versa.
         * if both candidate and current are fully consumed, continue to find another sequence.
         * When all sequences of merge_seqs have been fully consumed, min_element would
         * return a ended sequence eventually, and merge process terminates at that time.
         */
        if (candidate.first == candidate.second && current.first != current.second) {
            return false;
        }
        if (candidate.first != candidate.second && current.first == current.second) {
            return true;
        }
        if (candidate.first == candidate.second && current.first == current.second) {
            return false;
        }
        /*
         * If candidate and current have not been fully consumed, compare key of their
         * current entry, take smaller one, if their key equals, compare timestamp,
         * and take larger one.
         * If timestamp equals, takes current, because first in data takes precedence in merge function.
         */
        if (candidate.first->key < current.first->key) {
            return true;
        } else if (candidate.first->key == current.first->key) {
            return candidate.first->timestamp >
                   current.first->timestamp;
        } else {
            return false;
        }
    };
    while (true) {
        auto merge_resolution = *merge_seqs.begin();
        for (auto seq2 = merge_seqs.begin(); seq2 != merge_seqs.end(); seq2++) {
            if (compare_merge_seqs_prefer_current(*seq2, merge_resolution)) {
                merge_resolution = *seq2;
            }
        }
        std::for_each(merge_seqs.begin(), merge_seqs.end(), [merge_resolution](MergeSeq &seq) {
            if (seq.first->key == merge_resolution.first->key && seq.first != seq.second) {
                ++seq.first;
            }
        });
        if (merge_resolution.first == merge_resolution.second) {
            break;
        }
        merge_result.push_back(*merge_resolution.first);
    }
    return merge_result;
}